

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
          (QVLABase<QPainter::PixmapFragment> *this,qsizetype prealloc,void *array,
          PixmapFragment *args)

{
  qsizetype *pqVar1;
  reference pvVar2;
  long lVar3;
  reference pvVar4;
  long aalloc;
  byte bVar5;
  
  bVar5 = 0;
  lVar3 = (this->super_QVLABaseBase).s;
  if (lVar3 == (this->super_QVLABaseBase).a) {
    aalloc = lVar3 + 1;
    if (lVar3 + 1 < lVar3 * 2) {
      aalloc = lVar3 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar3,aalloc);
    lVar3 = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (reference)(lVar3 * 0x50 + (long)(this->super_QVLABaseBase).ptr);
  pvVar4 = pvVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pvVar4->x = args->x;
    args = (PixmapFragment *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pvVar4 = (reference)((long)pvVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pvVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }